

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_eigensolver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  void *pvVar2;
  RealScalar RVar3;
  RealScalar RVar4;
  eigensolverOutput_t output;
  rotation_t eigensolver_rotation;
  rotation_t R_perturbed;
  translation_t t_perturbed;
  CentralRelativeAdapter adapter;
  rotation_t rotation;
  translation_t position;
  MatrixXd gt;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  rotations_t camRotations;
  translations_t camOffsets;
  rotation_t rotation2;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  size_t numberPoints;
  double outlierFraction;
  double noise;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff718;
  undefined8 uVar5;
  undefined4 uVar6;
  RelativeAdapterBase *this;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_fffffffffffff720;
  EigensolverOutput *this_00;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *other;
  unsigned_long *in_stack_fffffffffffff730;
  CentralRelativeAdapter *this_01;
  int *in_stack_fffffffffffff738;
  undefined1 useWeights;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffff740;
  eigensolverOutput_t *output_00;
  RelativeAdapterBase *in_stack_fffffffffffff748;
  rotations_t *in_stack_fffffffffffff798;
  translations_t *in_stack_fffffffffffff7a0;
  rotation_t *in_stack_fffffffffffff7a8;
  translation_t *in_stack_fffffffffffff7b0;
  rotation_t *in_stack_fffffffffffff7b8;
  rotation_t *in_stack_fffffffffffff7c0;
  translation_t *in_stack_fffffffffffff7c8;
  translation_t *in_stack_fffffffffffff7d0;
  double in_stack_fffffffffffff7f8;
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>_>
  *in_stack_fffffffffffff968;
  ostream *in_stack_fffffffffffff970;
  double in_stack_fffffffffffffcc8;
  double in_stack_fffffffffffffcd0;
  rotations_t *in_stack_fffffffffffffcd8;
  translations_t *in_stack_fffffffffffffce0;
  rotation_t *in_stack_fffffffffffffce8;
  translation_t *in_stack_fffffffffffffcf0;
  rotation_t *in_stack_fffffffffffffcf8;
  translation_t *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd10;
  bearingVectors_t *in_stack_fffffffffffffd18;
  bearingVectors_t *in_stack_fffffffffffffd20;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd28;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd30;
  MatrixXd *in_stack_fffffffffffffd38;
  undefined1 local_1b8 [72];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> local_170 [24];
  EigensolverOutput local_158;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  opengv::initializeRandomSeed();
  local_18 = 0x3fe0000000000000;
  local_20 = 0;
  local_28 = 10;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff720,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff718);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  opengv::generateRandomDirectionTranslation(in_stack_fffffffffffff7f8);
  opengv::generateRandomRotation((double)in_stack_fffffffffffffcd8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb85e10);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb85e1d);
  opengv::generateCentralCameraSystem(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb85e43);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0xb85e52);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb85e61);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xb85e6e);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            (in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  output_00 = (eigensolverOutput_t *)local_1b8;
  useWeights = (undefined1)((ulong)(local_1b8 + 0x18) >> 0x38);
  this_01 = (CentralRelativeAdapter *)(local_1b8 + 0x30);
  other = local_170;
  this_00 = &local_158;
  uVar5 = local_28;
  opengv::generateRandom2D2DCorrespondences
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             in_stack_fffffffffffffd10,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
             in_stack_fffffffffffffd18,in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd38);
  uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xb85f38);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb85f47);
  this = (RelativeAdapterBase *)CONCAT44(uVar6,1);
  opengv::extractRelativePose
            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
             in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
             SUB81((ulong)in_stack_fffffffffffff7a0 >> 0x38,0));
  opengv::printExperimentCharacteristics
            ((translation_t *)this_01,(rotation_t *)other,(double)this_00,(double)this);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (this_01,(bearingVectors_t *)other,(bearingVectors_t *)this_00,(rotation_t *)this);
  poVar1 = std::operator<<((ostream *)&std::cout,"running eigensolver with perturbed rotation");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xb86019);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb86028);
  opengv::getPerturbedPose
            ((translation_t *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,(double)in_stack_fffffffffffff7a0);
  opengv::relative_pose::RelativeAdapterBase::setR12
            ((RelativeAdapterBase *)this_00,(rotation_t *)this);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xb8607d);
  opengv::EigensolverOutput::EigensolverOutput(this_00);
  opengv::relative_pose::RelativeAdapterBase::getR12(this);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)this_00,(Matrix<double,_3,_3,_0,_3,_3> *)this);
  opengv::relative_pose::eigensolver(in_stack_fffffffffffff748,output_00,(bool)useWeights);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)this_00,(Matrix<double,_3,_3,_0,_3,_3> *)this);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from eigensystem based rotation solver:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff970,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             in_stack_fffffffffffff968);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the eigenvectors are: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff970,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             in_stack_fffffffffffff968);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the eigenvalues are: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_fffffffffffff970,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                             in_stack_fffffffffffff968);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the norms of the eigenvectors are: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     this);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,RVar3);
  std::operator<<(poVar1," ");
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     this);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,RVar3);
  std::operator<<(poVar1," ");
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     this);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,RVar3);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the orthogongality is: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>>::
  operator*((MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
             *)this_01,other);
  Eigen::operator<<(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  std::operator<<((ostream *)&std::cout," ");
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>>::
  operator*((MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
             *)this_01,other);
  Eigen::operator<<(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  std::operator<<((ostream *)&std::cout," ");
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)other);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>>::
  operator*((MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
             *)this_01,other);
  Eigen::operator<<(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the norm of the translation is: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,RVar4);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter
            ((CentralRelativeAdapter *)0xb86675);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb86682);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_01);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_01);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)this_01);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)this_01);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomDirectionTranslation(0.0005);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //run experiments
  std::cout << "running eigensolver with perturbed rotation" << std::endl;
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  adapter.setR12(R_perturbed);
  rotation_t eigensolver_rotation;
  eigensolverOutput_t output;
  output.rotation = adapter.getR12(); //transferring the initial value
  eigensolver_rotation = relative_pose::eigensolver(adapter,output);

  //print results
  std::cout << "results from eigensystem based rotation solver:" << std::endl;
  std::cout << eigensolver_rotation << std::endl << std::endl;
  std::cout << "the eigenvectors are: " << std::endl;
  std::cout << output.eigenvectors << std::endl << std::endl;
  std::cout << "the eigenvalues are: " << std::endl;
  std::cout << output.eigenvalues << std::endl << std::endl;
  std::cout << "the norms of the eigenvectors are: " << std::endl;
  std::cout << output.eigenvectors.col(0).norm() << " ";
  std::cout << output.eigenvectors.col(1).norm() << " ";
  std::cout << output.eigenvectors.col(2).norm() << std::endl << std::endl;
  std::cout << "the orthogongality is: " << std::endl;
  std::cout << output.eigenvectors.col(0).transpose()*output.eigenvectors.col(1);
  std::cout << " ";
  std::cout << output.eigenvectors.col(0).transpose()*output.eigenvectors.col(2);
  std::cout << " ";
  std::cout << output.eigenvectors.col(1).transpose()*output.eigenvectors.col(2);
  std::cout << std::endl << std::endl;
  std::cout << "the norm of the translation is: " << std::endl;
  std::cout << output.translation.norm() << std::endl;

}